

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# floor1.c
# Opt level: O2

int fit_line(lsfit_acc *a,int fits,int *y0,int *y1,vorbis_info_floor1 *info)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  int iVar14;
  int iVar16;
  double dVar15;
  
  iVar5 = a->x0;
  iVar6 = a[(long)fits + -1].x1;
  uVar7 = 0;
  uVar8 = (ulong)(uint)fits;
  if (fits < 1) {
    uVar8 = uVar7;
  }
  dVar9 = 0.0;
  dVar10 = 0.0;
  dVar11 = 0.0;
  dVar12 = 0.0;
  dVar13 = 0.0;
  for (; uVar8 * 0x38 - uVar7 != 0; uVar7 = uVar7 + 0x38) {
    uVar1 = *(undefined8 *)((long)&a->yb + uVar7);
    uVar2 = *(undefined8 *)((long)&a->ya + uVar7);
    uVar3 = *(undefined8 *)((long)&a->xyb + uVar7);
    uVar4 = *(undefined8 *)((long)&a->xya + uVar7);
    iVar16 = (int)((ulong)uVar4 >> 0x20);
    iVar14 = (int)((ulong)uVar3 >> 0x20);
    dVar15 = (double)(((float)(iVar16 + iVar14) * info->twofitweight) / (float)(iVar16 + 1)) + 1.0;
    dVar11 = dVar11 + (double)*(int *)((long)&a->xa + uVar7) * dVar15 +
                      (double)*(int *)((long)&a->xb + uVar7);
    dVar12 = dVar12 + dVar15 * (double)(int)((ulong)uVar2 >> 0x20) +
                      (double)(int)((ulong)uVar1 >> 0x20);
    dVar13 = dVar13 + dVar15 * (double)(int)uVar2 + (double)(int)uVar1;
    dVar9 = dVar9 + (double)iVar16 * dVar15 + (double)iVar14;
    dVar10 = dVar10 + (double)(int)uVar4 * dVar15 + (double)(int)uVar3;
  }
  iVar14 = *y0;
  if (-1 < iVar14) {
    dVar11 = dVar11 + (double)iVar5;
    dVar12 = dVar12 + (double)(iVar5 * iVar5);
    dVar13 = dVar13 + (double)iVar14;
    dVar9 = dVar9 + 1.0;
    dVar10 = dVar10 + (double)(iVar14 * iVar5);
  }
  iVar14 = *y1;
  if (-1 < iVar14) {
    dVar11 = dVar11 + (double)iVar6;
    dVar12 = dVar12 + (double)(iVar6 * iVar6);
    dVar13 = dVar13 + (double)iVar14;
    dVar9 = dVar9 + 1.0;
    dVar10 = dVar10 + (double)(iVar14 * iVar6);
  }
  dVar15 = dVar9 * dVar12 - dVar11 * dVar11;
  if (dVar15 <= 0.0) {
    *y0 = 0;
    iVar5 = 1;
  }
  else {
    dVar12 = (dVar13 * dVar12 - dVar11 * dVar10) / dVar15;
    dVar15 = (dVar10 * dVar9 + dVar13 * -dVar11) / dVar15;
    dVar9 = rint((double)iVar5 * dVar15 + dVar12);
    *y0 = (int)dVar9;
    dVar9 = rint(dVar15 * (double)iVar6 + dVar12);
    iVar6 = (int)dVar9;
    *y1 = iVar6;
    iVar5 = *y0;
    if (0x3ff < iVar5) {
      *y0 = 0x3ff;
      iVar6 = *y1;
      iVar5 = 0x3ff;
    }
    if (0x3ff < iVar6) {
      *y1 = 0x3ff;
      iVar5 = *y0;
      iVar6 = 0x3ff;
    }
    if (iVar5 < 0) {
      *y0 = 0;
      iVar6 = *y1;
    }
    iVar5 = 0;
    if (-1 < iVar6) {
      return 0;
    }
  }
  *y1 = 0;
  return iVar5;
}

Assistant:

static int fit_line(lsfit_acc *a,int fits,int *y0,int *y1,
                    vorbis_info_floor1 *info){
  double xb=0,yb=0,x2b=0,y2b=0,xyb=0,bn=0;
  int i;
  int x0=a[0].x0;
  int x1=a[fits-1].x1;

  for(i=0;i<fits;i++){
    double weight = (a[i].bn+a[i].an)*info->twofitweight/(a[i].an+1)+1.;

    xb+=a[i].xb + a[i].xa * weight;
    yb+=a[i].yb + a[i].ya * weight;
    x2b+=a[i].x2b + a[i].x2a * weight;
    y2b+=a[i].y2b + a[i].y2a * weight;
    xyb+=a[i].xyb + a[i].xya * weight;
    bn+=a[i].bn + a[i].an * weight;
  }

  if(*y0>=0){
    xb+=   x0;
    yb+=  *y0;
    x2b+=  x0 *  x0;
    y2b+= *y0 * *y0;
    xyb+= *y0 *  x0;
    bn++;
  }

  if(*y1>=0){
    xb+=   x1;
    yb+=  *y1;
    x2b+=  x1 *  x1;
    y2b+= *y1 * *y1;
    xyb+= *y1 *  x1;
    bn++;
  }

  {
    double denom=(bn*x2b-xb*xb);

    if(denom>0.){
      double a=(yb*x2b-xyb*xb)/denom;
      double b=(bn*xyb-xb*yb)/denom;
      *y0=rint(a+b*x0);
      *y1=rint(a+b*x1);

      /* limit to our range! */
      if(*y0>1023)*y0=1023;
      if(*y1>1023)*y1=1023;
      if(*y0<0)*y0=0;
      if(*y1<0)*y1=0;

      return 0;
    }else{
      *y0=0;
      *y1=0;
      return 1;
    }
  }
}